

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * __thiscall
cmSystemTools::RelativePath_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *local,char *remote)

{
  bool bVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath((char *)this);
  if (!bVar1) {
    Error("RelativePath must be passed a full path to local: ",(char *)this,(char *)0x0,(char *)0x0)
    ;
  }
  bVar1 = cmsys::SystemTools::FileIsFullPath(local);
  if (!bVar1) {
    Error("RelativePath must be passed a full path to remote: ",local,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::string((string *)&local_38,(char *)this,&local_59);
  std::__cxx11::string::string((string *)&local_58,local,&local_5a);
  cmsys::SystemTools::RelativePath(__return_storage_ptr__,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::RelativePath(const char* local, const char* remote)
{
  if (!cmSystemTools::FileIsFullPath(local)) {
    cmSystemTools::Error("RelativePath must be passed a full path to local: ",
                         local);
  }
  if (!cmSystemTools::FileIsFullPath(remote)) {
    cmSystemTools::Error("RelativePath must be passed a full path to remote: ",
                         remote);
  }
  return cmsys::SystemTools::RelativePath(local, remote);
}